

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

void __thiscall DebugUtilsData::EndLabelRegion(DebugUtilsData *this,XrSession session)

{
  bool bVar1;
  XrSdkSessionLabelList *label_vec;
  XrSdkSessionLabelList *vec_ptr;
  XrSession session_local;
  DebugUtilsData *this_local;
  
  label_vec = GetSessionLabelList(this,session);
  if (label_vec != (XrSdkSessionLabelList *)0x0) {
    RemoveIndividualLabel(this,label_vec);
    bVar1 = std::
            vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
            ::empty(label_vec);
    if (!bVar1) {
      std::
      vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
      ::pop_back(label_vec);
    }
  }
  return;
}

Assistant:

void DebugUtilsData::EndLabelRegion(XrSession session) {
    XrSdkSessionLabelList* vec_ptr = GetSessionLabelList(session);
    if (vec_ptr == nullptr) {
        return;
    }

    // Individual labels do not stay around in the transition out of label region
    RemoveIndividualLabel(*vec_ptr);

    // Remove the last label region
    if (!vec_ptr->empty()) {
        vec_ptr->pop_back();
    }
}